

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conncache.c
# Opt level: O2

_Bool Curl_cpool_find(Curl_easy *data,char *destination,Curl_cpool_conn_match_cb *conn_cb,
                     Curl_cpool_done_match_cb *done_cb,void *userdata)

{
  _Bool _Var1;
  cpool *h;
  size_t sVar2;
  Curl_llist *list;
  Curl_llist_node *n;
  connectdata *pcVar3;
  
  h = cpool_get_instance(data);
  if (h == (cpool *)0x0) {
    _Var1 = false;
  }
  else {
    if ((h->share != (Curl_share *)0x0) && ((h->share->specifier & 0x20) != 0)) {
      Curl_share_lock(data,CURL_LOCK_DATA_CONNECT,CURL_LOCK_ACCESS_SINGLE);
    }
    h->field_0x68 = h->field_0x68 | 1;
    sVar2 = strlen(destination);
    list = (Curl_llist *)Curl_hash_pick(&h->dest2bundle,destination,sVar2 + 1);
    if (list == (Curl_llist *)0x0) {
LAB_00119da8:
      _Var1 = false;
    }
    else {
      n = Curl_llist_head(list);
      do {
        if (n == (Curl_llist_node *)0x0) goto LAB_00119da8;
        pcVar3 = (connectdata *)Curl_node_elem(n);
        n = Curl_node_next(n);
        _Var1 = (*conn_cb)(pcVar3,userdata);
      } while (!_Var1);
      _Var1 = true;
    }
    if (done_cb != (Curl_cpool_done_match_cb *)0x0) {
      _Var1 = (*done_cb)(_Var1,userdata);
    }
    h->field_0x68 = h->field_0x68 & 0xfe;
    if ((h->share != (Curl_share *)0x0) && ((h->share->specifier & 0x20) != 0)) {
      Curl_share_unlock(data,CURL_LOCK_DATA_CONNECT);
    }
  }
  return _Var1;
}

Assistant:

bool Curl_cpool_find(struct Curl_easy *data,
                     const char *destination,
                     Curl_cpool_conn_match_cb *conn_cb,
                     Curl_cpool_done_match_cb *done_cb,
                     void *userdata)
{
  struct cpool *cpool = cpool_get_instance(data);
  struct cpool_bundle *bundle;
  bool result = FALSE;

  DEBUGASSERT(cpool);
  DEBUGASSERT(conn_cb);
  if(!cpool)
    return FALSE;

  CPOOL_LOCK(cpool, data);
  bundle = Curl_hash_pick(&cpool->dest2bundle,
                          CURL_UNCONST(destination),
                          strlen(destination) + 1);
  if(bundle) {
    struct Curl_llist_node *curr = Curl_llist_head(&bundle->conns);
    while(curr) {
      struct connectdata *conn = Curl_node_elem(curr);
      /* Get next node now. callback might discard current */
      curr = Curl_node_next(curr);

      if(conn_cb(conn, userdata)) {
        result = TRUE;
        break;
      }
    }
  }

  if(done_cb) {
    result = done_cb(result, userdata);
  }
  CPOOL_UNLOCK(cpool, data);
  return result;
}